

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O0

service_availability_t parse_service_availability(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    value_local._4_4_ = SA_UNAVAILABLE;
  }
  else {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      value_local._4_4_ = SA_AVAILABLE;
    }
    else {
      value_local._4_4_ = SA_NOT_SET;
    }
  }
  return value_local._4_4_;
}

Assistant:

service_availability_t parse_service_availability(const char *value) {
    if (strcmp(value, "0") == 0)
        return SA_UNAVAILABLE;
    else if (strcmp(value, "1") == 0)
        return SA_AVAILABLE;
    else
        return SA_NOT_SET;
}